

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structurally_valid.cc
# Opt level: O3

int google::protobuf::internal::UTF8GenericScanFastAscii
              (UTF8ScanObj *st,char *str,int str_length,int *bytes_consumed)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  ulong uVar4;
  uint *puVar5;
  uint *puVar6;
  int rest_consumed;
  int local_3c;
  int *local_38;
  
  *bytes_consumed = 0;
  if (str_length == 0) {
    return 0xf1;
  }
  puVar1 = (uint *)(str + str_length);
  puVar5 = (uint *)str;
  local_38 = bytes_consumed;
  puVar6 = (uint *)(str + (long)str_length + -7);
  if (str_length < 7) {
    puVar6 = (uint *)str;
  }
  do {
    uVar4 = (ulong)puVar5 & 7;
    puVar2 = puVar5;
    if (puVar5 < puVar1 && uVar4 != 0) {
      do {
        if ((char)*puVar5 < '\0') goto LAB_001d93fb;
        puVar5 = (uint *)((long)puVar5 + 1);
        uVar4 = (ulong)((long)puVar2 + 1) & 7;
      } while ((uVar4 != 0) && (puVar2 = (uint *)((long)puVar2 + 1), puVar5 < puVar1));
    }
    if (puVar5 < puVar6 && uVar4 == 0) {
      do {
        if (((puVar5[1] | *puVar5) & 0x80808080) != 0) break;
        puVar5 = puVar5 + 2;
      } while (puVar5 < puVar6);
    }
LAB_001d93fb:
    for (; (puVar5 < puVar1 && (-1 < (char)*puVar5)); puVar5 = (uint *)((long)puVar5 + 1)) {
    }
    iVar3 = (int)puVar5 - (int)str;
    iVar3 = UTF8GenericScan(st,str + iVar3,str_length - iVar3,&local_3c);
    puVar5 = (uint *)((long)local_3c + (long)puVar5);
    if (iVar3 != 0xfd) {
      *local_38 = (int)puVar5 - (int)str;
      return iVar3;
    }
  } while( true );
}

Assistant:

int UTF8GenericScanFastAscii(const UTF8ScanObj* st,
                    const char * str,
                    int str_length,
                    int* bytes_consumed) {
  *bytes_consumed = 0;
  if (str_length == 0) return kExitOK;

  const uint8* isrc =  reinterpret_cast<const uint8*>(str);
  const uint8* src = isrc;
  const uint8* srclimit = isrc + str_length;
  const uint8* srclimit8 = str_length < 7 ? isrc : srclimit - 7;
  int n;
  int rest_consumed;
  int exit_reason;
  do {
    // Check initial few bytes one at a time until 8-byte aligned
    while ((((uintptr_t)src & 0x07) != 0) &&
           (src < srclimit) && (src[0] < 0x80)) {
      src++;
    }
    if (((uintptr_t)src & 0x07) == 0) {
      while ((src < srclimit8) &&
             (((reinterpret_cast<const uint32*>(src)[0] |
                reinterpret_cast<const uint32*>(src)[1]) & 0x80808080) == 0)) {
        src += 8;
      }
    }
    while ((src < srclimit) && (src[0] < 0x80)) {
      src++;
    }
    // Run state table on the rest
    n = src - isrc;
    exit_reason = UTF8GenericScan(st, str + n, str_length - n, &rest_consumed);
    src += rest_consumed;
  } while ( exit_reason == kExitDoAgain );

  *bytes_consumed = src - isrc;
  return exit_reason;
}